

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<cv::Mat>,testing::Matcher<cv::Rect_<int>>>,std::tuple<cv::Mat,cv::Rect_<int>>>
               (tuple<testing::Matcher<cv::Mat>,_testing::Matcher<cv::Rect_<int>_>_> *matcher_tuple,
               tuple<cv::Mat,_cv::Rect_<int>_> *value_tuple)

{
  bool bVar1;
  Rect_<int> local_28;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<cv::Mat>,testing::Matcher<cv::Rect_<int>>>,std::tuple<cv::Mat,cv::Rect_<int>>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    local_28.x = (value_tuple->super__Tuple_impl<0UL,_cv::Mat,_cv::Rect_<int>_>).
                 super__Tuple_impl<1UL,_cv::Rect_<int>_>.
                 super__Head_base<1UL,_cv::Rect_<int>,_false>._M_head_impl.x;
    local_28.y = (value_tuple->super__Tuple_impl<0UL,_cv::Mat,_cv::Rect_<int>_>).
                 super__Tuple_impl<1UL,_cv::Rect_<int>_>.
                 super__Head_base<1UL,_cv::Rect_<int>,_false>._M_head_impl.y;
    local_28.width =
         (value_tuple->super__Tuple_impl<0UL,_cv::Mat,_cv::Rect_<int>_>).
         super__Tuple_impl<1UL,_cv::Rect_<int>_>.super__Head_base<1UL,_cv::Rect_<int>,_false>.
         _M_head_impl.width;
    local_28.height =
         (value_tuple->super__Tuple_impl<0UL,_cv::Mat,_cv::Rect_<int>_>).
         super__Tuple_impl<1UL,_cv::Rect_<int>_>.super__Head_base<1UL,_cv::Rect_<int>,_false>.
         _M_head_impl.height;
    bVar1 = MatcherBase<cv::Rect_<int>_>::Matches
                      ((MatcherBase<cv::Rect_<int>_> *)matcher_tuple,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }